

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

bool __thiscall
wasm::
SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
::usingFixed(SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
             *this)

{
  bool bVar1;
  SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  *this_local;
  
  bVar1 = std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::empty(&this->flexible);
  return bVar1;
}

Assistant:

bool usingFixed() const {
    // If the flexible storage contains something, then we are using it.
    // Otherwise we use the fixed storage. Note that if we grow and shrink then
    // we will stay in flexible mode until we reach a size of zero, at which
    // point we return to fixed mode. This is intentional, to avoid a lot of
    // movement in switching between fixed and flexible mode.
    return flexible.empty();
  }